

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureWrapCase::testTexture(TextureWrapCase *this)

{
  TexParamVerifier *pTVar1;
  int local_24;
  int local_20;
  int ndx_1;
  int ndx;
  GLenum wrapValues [3];
  TextureWrapCase *this_local;
  
  _ndx_1 = 0x29010000812f;
  wrapValues[0] = 0x8370;
  pTVar1 = (this->super_TextureCase).m_verifier;
  wrapValues._4_8_ = this;
  (*pTVar1->_vptr_TexParamVerifier[2])
            (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
             (ulong)this->m_valueName,0x2901);
  ApiCase::expectError((ApiCase *)this,0);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,this->m_valueName,(&ndx_1)[local_20]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               (ulong)this->m_valueName,(ulong)(uint)(&ndx_1)[local_20]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    glu::CallLogWrapper::glTexParameterf
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,this->m_valueName,
               (float)(uint)(&ndx_1)[local_24]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               (ulong)this->m_valueName,(ulong)(uint)(&ndx_1)[local_24]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testTexture (void)
	{
		const GLenum wrapValues[] = {GL_CLAMP_TO_EDGE, GL_REPEAT, GL_MIRRORED_REPEAT};

		m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, GL_REPEAT);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
		{
			glTexParameteri(m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);
		}

		//check unit conversions with float

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
		{
			glTexParameterf(m_textureTarget, m_valueName, (GLfloat)wrapValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}